

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::propagateError(CoreBroker *this,ActionMessage *cmd)

{
  BrokerBase *this_00;
  string_view message;
  string_view message_00;
  string_view estring;
  string_view name;
  string_view name_00;
  
  this_00 = &this->super_BrokerBase;
  message._M_str = (char *)(cmd->payload).heap;
  message._M_len = (cmd->payload).bufferSize;
  name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  name._M_len = (this->super_BrokerBase).identifier._M_string_length;
  BrokerBase::sendToLogger
            (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0,name,
             message,false);
  if ((cmd->messageAction == cmd_local_error) &&
     ((this->super_BrokerBase).terminate_on_error == true)) {
    message_00._M_str = "Error Escalation: Federation terminating";
    message_00._M_len = 0x28;
    name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0,
               name_00,message_00,false);
    ActionMessage::setAction(cmd,cmd_global_error);
    estring._M_str = (char *)(cmd->payload).heap;
    estring._M_len = (cmd->payload).bufferSize;
    BrokerBase::setErrorState(this_00,cmd->messageID,estring);
    broadcast(this,cmd);
    if (((this->super_BrokerBase).field_0x293 & 1) != 0) {
      return;
    }
    transmitToParent(this,cmd);
    return;
  }
  routeMessage(this,cmd);
  return;
}

Assistant:

void CoreBroker::propagateError(ActionMessage&& cmd)
{
    LOG_ERROR(global_broker_id_local, getIdentifier(), cmd.payload.to_string());
    if (cmd.action() == CMD_LOCAL_ERROR) {
        if (terminate_on_error) {
            LOG_ERROR(global_broker_id_local,
                      getIdentifier(),
                      "Error Escalation: Federation terminating");
            cmd.setAction(CMD_GLOBAL_ERROR);
            setErrorState(cmd.messageID, cmd.payload.to_string());
            broadcast(cmd);
            if (!isRoot()) {
                transmitToParent(std::move(cmd));
            } else {
            }
            return;
        }
    }
    routeMessage(std::move(cmd));
}